

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O1

void __thiscall RoleMaskProxyModel::setMergeDisplayEdit(RoleMaskProxyModel *this,bool val)

{
  QSet<int> *this_00;
  RoleMaskProxyModelPrivate *this_01;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this_02;
  ulong uVar1;
  Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *pDVar2;
  Node<int,_QHashDummyValue> *pNVar3;
  iterator iVar4;
  iterator iVar5;
  Data *pDVar6;
  ulong uVar7;
  long *plVar8;
  anon_class_1_1_ba1d8281 setMergeDisplayEditContainer;
  anon_class_1_1_ba1d8281 local_6a;
  QHashDummyValue local_69;
  RoleMaskProxyModel *local_68;
  QVector<int> local_60;
  QModelIndex local_48;
  
  this_01 = this->d_ptr;
  if (this_01->m_mergeDisplayEdit != val) {
    local_6a.val = val;
    local_68 = this;
    local_60.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_60,4,8,2,KeepSize);
    local_60.d.ptr[0] = 0;
    local_60.d.ptr[1] = 2;
    local_60.d.size = 2;
    this_01->m_mergeDisplayEdit = val;
    pDVar2 = (this_01->m_masked).d;
    if ((pDVar2 == (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_>::
               detached(pDVar2,0);
      (this_01->m_masked).d = pDVar2;
    }
    pDVar6 = (this_01->m_masked).d;
    if (pDVar6->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar7 = uVar1;
        if (pDVar6->numBuckets == uVar7) {
          pDVar6 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar1 = uVar7 + 1;
      } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    }
    else {
      uVar7 = 0;
    }
    if (pDVar6 == (Data *)0x0) {
      plVar8 = (long *)0x0;
    }
    else {
      plVar8 = (long *)((long)&pDVar6->spans[uVar7 >> 7].entries
                               [pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].storage + 8);
    }
    if (plVar8 != (long *)0x0) {
      do {
        setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                  (&local_6a,(RolesContainer *)*plVar8);
        if (*(long *)(*plVar8 + 0x18) == 0) {
          do {
            if (pDVar6->numBuckets - 1 == uVar7) {
              uVar7 = 0;
              pDVar6 = (Data *)0x0;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
          if (pDVar6 == (Data *)0x0) {
            plVar8 = (long *)0x0;
          }
          else {
            plVar8 = (long *)((long)&pDVar6->spans[uVar7 >> 7].entries
                                     [pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].storage
                             + 8);
          }
        }
        else {
          plVar8 = (long *)(*plVar8 + 0x18);
        }
      } while (plVar8 != (long *)0x0);
    }
    this_00 = &this_01->m_maskedRoles;
    if (val) {
      local_48.r = 2;
      QHash<int,_QHashDummyValue>::remove(&this_00->q_hash,(char *)&local_48);
    }
    else {
      local_48._0_8_ = (ulong)(uint)local_48.c << 0x20;
      this_02 = (this_00->q_hash).d;
      if ((this_02 != (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) &&
         (pNVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode
                             (this_02,&local_48.r), pNVar3 != (Node<int,_QHashDummyValue> *)0x0)) {
        local_48.r = 2;
        QHash<int,_QHashDummyValue>::emplace<QHashDummyValue>
                  (&this_00->q_hash,&local_48.r,&local_69);
      }
    }
    if (this_01->m_maskHeaderData == true) {
      iVar4 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_hHeaderData);
      iVar5 = QList<QMap<int,_QVariant>_>::end(&this_01->m_hHeaderData);
      if (iVar4.i != iVar5.i) {
        do {
          setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()(&local_6a,iVar4.i);
          iVar4.i = iVar4.i + 1;
        } while (iVar4.i != iVar5.i);
      }
      iVar4 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_vHeaderData);
      iVar5 = QList<QMap<int,_QVariant>_>::end(&this_01->m_vHeaderData);
      if (iVar4.i != iVar5.i) {
        do {
          setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()(&local_6a,iVar4.i);
          iVar4.i = iVar4.i + 1;
        } while (iVar4.i != iVar5.i);
      }
    }
    mergeDisplayEditChanged(local_68,this_01->m_mergeDisplayEdit);
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m = (QAbstractItemModel *)0x0;
    RoleMaskProxyModelPrivate::signalAllChanged(this_01,&local_60,&local_48);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,4,8);
      }
    }
  }
  return;
}

Assistant:

void RoleMaskProxyModel::setMergeDisplayEdit(bool val)
{
    const auto setMergeDisplayEditContainer = [val](RolesContainer &container) {
        if (val) {
            if (container.contains(Qt::DisplayRole)) {
                container.remove(Qt::EditRole);
            } else {
                const auto roleIter = container.constFind(Qt::EditRole);
                if (roleIter != container.constEnd()) {
                    container.insert(Qt::DisplayRole, *roleIter);
                    container.remove(Qt::EditRole);
                }
            }
        } else {
            const auto roleIter = container.constFind(Qt::DisplayRole);
            if (roleIter != container.constEnd()) {
                container.insert(Qt::EditRole, *roleIter);
            }
        }
    };
    Q_D(RoleMaskProxyModel);
    if (d->m_mergeDisplayEdit != val) {
        QVector<int> changedRoles({Qt::DisplayRole, Qt::EditRole});
        d->m_mergeDisplayEdit = val;
        for (auto idxIter = d->m_masked.begin(), idxEnd = d->m_masked.end(); idxIter != idxEnd; ++idxIter)
            setMergeDisplayEditContainer(idxIter->m_data.roles);
        if (val)
            d->m_maskedRoles.remove(Qt::EditRole);
        else if (d->m_maskedRoles.contains(Qt::DisplayRole))
            d->m_maskedRoles.insert(Qt::EditRole);
        if (d->m_maskHeaderData) {
            for (auto idxIter = d->m_hHeaderData.begin(), idxEnd = d->m_hHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
            for (auto idxIter = d->m_vHeaderData.begin(), idxEnd = d->m_vHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
        }
        mergeDisplayEditChanged(d->m_mergeDisplayEdit);
        d->signalAllChanged(changedRoles);
    }
}